

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

int knote_enable(filter *filt,knote *kn)

{
  long in_RSI;
  long in_RDI;
  int rv;
  undefined4 local_4;
  
  if ((*(ushort *)(in_RSI + 10) & 8) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x50))(in_RDI,in_RSI);
    if (local_4 == 0) {
      *(ushort *)(in_RSI + 10) = *(ushort *)(in_RSI + 10) & 0xfff7;
    }
  }
  return local_4;
}

Assistant:

int
knote_enable(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    /* If the knote is already enabled, this call is a noop */
    if (KNOTE_ENABLED(kn))
        return (0);

    dbg_printf("kn=%p - calling kn_enable", kn);
    rv = filt->kn_enable(filt, kn);
    dbg_printf("kn=%p - kn_enable rv=%i", kn, rv);
    if (rv == 0) KNOTE_ENABLE(kn);
    return (rv);
}